

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O1

void __thiscall wabt::OpcodeInfo::Write(OpcodeInfo *this,Stream *stream)

{
  uint uVar1;
  Enum EVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  Enum *pEVar5;
  float *pfVar6;
  uint *puVar7;
  Type *pTVar8;
  char *pcVar9;
  unsigned_long uVar10;
  pair<const_unsigned_int_*,_unsigned_long> pVar11;
  char buffer [41];
  Type local_68;
  undefined4 uStack_64;
  
  pTVar8 = &local_68;
  Opcode::GetInfo(&this->opcode_);
  Stream::Writef(stream,"%s",CONCAT44(uStack_64,local_68.enum_));
  switch(this->kind_) {
  case Uint32:
    puVar7 = GetData<unsigned_int>(this,1);
    uVar1 = *puVar7;
    puVar7 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u (0x%x)",(ulong)uVar1,(ulong)*puVar7);
    break;
  case Uint64:
    puVar4 = GetData<unsigned_long>(this,1);
    uVar10 = *puVar4;
    puVar4 = GetData<unsigned_long>(this,1);
    Stream::Writef(stream," %lu (0x%lx)",uVar10,*puVar4);
    break;
  case Index:
    pEVar5 = (Enum *)GetData<unsigned_int>(this,1);
    EVar2 = *pEVar5;
    pcVar9 = " %u";
LAB_00127acb:
    Stream::Writef(stream,pcVar9,(ulong)(uint)EVar2);
    break;
  case Float32:
    pfVar6 = GetData<float>(this,1);
    Stream::Writef(stream," %g",(double)*pfVar6);
    puVar7 = GetData<unsigned_int>(this,1);
    WriteFloatHex((char *)&local_68,0x15,*puVar7);
    goto LAB_00127995;
  case Float64:
    pdVar3 = GetData<double>(this,1);
    Stream::Writef(stream," %g",*pdVar3);
    puVar4 = GetData<unsigned_long>(this,1);
    WriteDoubleHex((char *)&local_68,0x29,*puVar4);
LAB_00127995:
    pcVar9 = " (%s)";
LAB_001279a2:
    Stream::Writef(stream,pcVar9,pTVar8);
    break;
  case Uint32Uint32:
    pVar11 = GetDataArray<unsigned_int>(this);
    if (pVar11.second != 0) {
      uVar10 = 0;
      do {
        pcVar9 = ", ";
        if (uVar10 == 0) {
          pcVar9 = " ";
        }
        Stream::Writef(stream,"%s",pcVar9);
        Stream::Writef(stream,"%u",(ulong)pVar11.first[uVar10]);
        uVar10 = uVar10 + 1;
      } while (pVar11.second != uVar10);
    }
    break;
  case BlockSig:
    pTVar8 = GetData<wabt::Type>(this,1);
    EVar2 = pTVar8->enum_;
    local_68.enum_ = EVar2;
    if (I32 < EVar2) {
      pcVar9 = " type:%d";
      goto LAB_00127acb;
    }
    if (EVar2 == Void) {
      return;
    }
    pTVar8 = (Type *)Type::GetName(&local_68);
    pcVar9 = " %s";
    goto LAB_001279a2;
  case BrTable:
    pVar11 = GetDataArray<unsigned_int>(this);
    if (pVar11.second != 0) {
      uVar10 = 0;
      do {
        pcVar9 = ", ";
        if (uVar10 == 0) {
          pcVar9 = " ";
        }
        Stream::Writef(stream,"%s",pcVar9);
        Stream::Writef(stream,"%u",(ulong)pVar11.first[uVar10]);
        uVar10 = uVar10 + 1;
      } while (pVar11.second != uVar10);
    }
  }
  return;
}

Assistant:

void OpcodeInfo::Write(Stream& stream) {
  stream.Writef("%s", opcode_.GetName());

  switch (kind_) {
    case Kind::Bare:
      break;

    case Kind::Uint32:
      stream.Writef(" %u (0x%x)", *GetData<uint32_t>(), *GetData<uint32_t>());
      break;

    case Kind::Uint64:
      stream.Writef(" %" PRIu64 " (0x%" PRIx64 ")", *GetData<uint64_t>(),
                    *GetData<uint64_t>());
      break;

    case Kind::Index:
      stream.Writef(" %" PRIindex, *GetData<Index>());
      break;

    case Kind::Float32: {
      stream.Writef(" %g", *GetData<float>());
      char buffer[WABT_MAX_FLOAT_HEX + 1];
      WriteFloatHex(buffer, sizeof(buffer), *GetData<uint32_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Float64: {
      stream.Writef(" %g", *GetData<double>());
      char buffer[WABT_MAX_DOUBLE_HEX + 1];
      WriteDoubleHex(buffer, sizeof(buffer), *GetData<uint64_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Uint32Uint32:
      WriteArray<uint32_t>(
          stream, [&stream](uint32_t value) { stream.Writef("%u", value); });
      break;

    case Kind::BlockSig: {
      auto type = *GetData<Type>();
      if (type.IsIndex()) {
        stream.Writef(" type:%d", type.GetIndex());
      } else if (type != Type::Void) {
        stream.Writef(" %s", type.GetName());
      }
      break;
    }

    case Kind::BrTable: {
      WriteArray<Index>(stream, [&stream](Index index) {
        stream.Writef("%" PRIindex, index);
      });
      break;
    }
  }
}